

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Mesh(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *p;
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  uint uVar6;
  char *pcVar7;
  uint local_48;
  uint local_44;
  uint local_3c;
  
  Extra_UtilGetoptReset();
  bVar1 = true;
  local_3c = 3;
  local_48 = 4;
  local_44 = 4;
  uVar6 = 1;
  do {
    while( true ) {
      while (iVar2 = Extra_UtilGetopt(argc,argv,"XYTsh"), iVar4 = globalUtilOptind, iVar2 == 0x76) {
        uVar6 = uVar6 ^ 1;
      }
      if (iVar2 < 0x58) break;
      if (iVar2 == 0x73) {
        bVar1 = (bool)(bVar1 ^ 1);
      }
      else {
        if (iVar2 == 0x59) {
          if (argc <= globalUtilOptind) {
            pcVar5 = "Command line switch \"-Y\" should be followed by an integer.\n";
            goto LAB_0028a3e1;
          }
          uVar3 = atoi(argv[globalUtilOptind]);
          local_44 = uVar3;
        }
        else {
          if (iVar2 != 0x58) goto LAB_0028a3ed;
          if (argc <= globalUtilOptind) {
            pcVar5 = "Command line switch \"-X\" should be followed by an integer.\n";
LAB_0028a3e1:
            Abc_Print(-1,pcVar5);
            goto LAB_0028a3ed;
          }
          uVar3 = atoi(argv[globalUtilOptind]);
          local_48 = uVar3;
        }
        globalUtilOptind = iVar4 + 1;
        if ((int)uVar3 < 3) goto LAB_0028a3ed;
      }
    }
    if (iVar2 == -1) {
      p = pAbc->pGia;
      if (p == (Gia_Man_t *)0x0) {
        pcVar5 = "Abc_CommandAbc9Mesh(): There is no design.\n";
      }
      else if (p->vCos->nSize == 1) {
        if (p->vCis->nSize < 0x15) {
          iVar4 = Gia_ManLevelNum(p);
          if ((int)local_3c < iVar4) {
            uVar6 = Gia_ManLevelNum(pAbc->pGia);
            Abc_Print(-1,"The depth of the AIG (%d) cannot be larger than the latency (%d).\n",
                      (ulong)uVar6,(ulong)local_3c);
            return 1;
          }
          if (bVar1) {
            Bmc_MeshTest(pAbc->pGia,local_48,local_44,local_3c,uVar6);
          }
          else {
            Bmc_MeshTest2(pAbc->pGia,local_48,local_44,local_3c,uVar6);
          }
          return 0;
        }
        pcVar5 = "Currently this command expects AIG with no more than 20 nodes.\n";
      }
      else {
        pcVar5 = "Currently this command expects AIG with one output.\n";
      }
      iVar4 = -1;
      goto LAB_0028a4ac;
    }
    if (iVar2 != 0x54) break;
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-T\" should be followed by an integer.\n";
      goto LAB_0028a3e1;
    }
    local_3c = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
  } while (1 < (int)local_3c);
LAB_0028a3ed:
  Abc_Print(-2,"usage: &mesh [-XYT num] [-sh]\n");
  Abc_Print(-2,"\t         creates a mesh architecture for the given AIG\n");
  Abc_Print(-2,"\t-X num : horizontal size of the mesh (X >= 3) [default = %d]\n",(ulong)local_48);
  Abc_Print(-2,"\t-Y num : vertical size of the mesh (Y >= 3) [default = %d]\n",(ulong)local_44);
  Abc_Print(-2,"\t-T num : the latency of the mesh (T >= 2) [default = %d]\n",(ulong)local_3c);
  pcVar7 = "yes";
  pcVar5 = "yes";
  if (!bVar1) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-s     : toggle using new SAT solver Satoko [default = %s]\n",pcVar5);
  if (uVar6 == 0) {
    pcVar7 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar7);
  pcVar5 = "\t-h     : print the command usage\n";
  iVar4 = -2;
LAB_0028a4ac:
  Abc_Print(iVar4,pcVar5);
  return 1;
}

Assistant:

int Abc_CommandAbc9Mesh( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Bmc_MeshTest( Gia_Man_t * p, int X, int Y, int T, int fVerbose );
    extern void Bmc_MeshTest2( Gia_Man_t * p, int X, int Y, int T, int fVerbose );
    int X =  4;
    int Y =  4;
    int T =  3;
    int fUseSatoko = 1;
    int c, fVerbose = 1;
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "XYTsh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'X':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-X\" should be followed by an integer.\n" );
                goto usage;
            }
            X = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( X < 3 )
                goto usage;
            break;
        case 'Y':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Y\" should be followed by an integer.\n" );
                goto usage;
            }
            Y = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Y < 3 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            T = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( T < 2 )
                goto usage;
            break;
        case 's':
            fUseSatoko ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Mesh(): There is no design.\n" );
        return 1;
    }
    if ( Gia_ManCoNum(pAbc->pGia) != 1 )
    {
        Abc_Print( -1, "Currently this command expects AIG with one output.\n" );
        return 1;
    }
    if ( Gia_ManCiNum(pAbc->pGia) > 20 )
    {
        Abc_Print( -1, "Currently this command expects AIG with no more than 20 nodes.\n" );
        return 1;
    }
    if ( Gia_ManLevelNum(pAbc->pGia) > T )
    {
        Abc_Print( -1, "The depth of the AIG (%d) cannot be larger than the latency (%d).\n", Gia_ManLevelNum(pAbc->pGia), T );
        return 1;
    }
    if ( fUseSatoko )
        Bmc_MeshTest( pAbc->pGia, X, Y, T, fVerbose );
    else
        Bmc_MeshTest2( pAbc->pGia, X, Y, T, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &mesh [-XYT num] [-sh]\n" );
    Abc_Print( -2, "\t         creates a mesh architecture for the given AIG\n" );
    Abc_Print( -2, "\t-X num : horizontal size of the mesh (X >= 3) [default = %d]\n", X );
    Abc_Print( -2, "\t-Y num : vertical size of the mesh (Y >= 3) [default = %d]\n", Y );
    Abc_Print( -2, "\t-T num : the latency of the mesh (T >= 2) [default = %d]\n", T );
    Abc_Print( -2, "\t-s     : toggle using new SAT solver Satoko [default = %s]\n", fUseSatoko? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}